

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryFunctions.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
helics::vectorizeIndexQuery
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,helics *this,
          string_view queryres)

{
  bool bVar1;
  reference pbVar2;
  byte bVar3;
  double dVar4;
  string_view jsonString;
  json jVar5;
  int local_84;
  json v;
  iterator __begin4;
  string_view queryres_local;
  iterator __end4;
  
  queryres_local._M_str = (char *)queryres._M_len;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this != (helics *)0x0) {
    queryres_local._M_len = (size_t)this;
    if (*queryres_local._M_str == '[') {
      jsonString._M_str = (char *)this;
      jsonString._M_len = (size_t)&v;
      jVar5 = fileops::loadJsonStr_abi_cxx11_(jsonString);
      if (v.m_data.m_type == array) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::begin(&__begin4,&v);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::end(&__end4,&v);
        while( true ) {
          bVar1 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            (&__begin4,&__end4);
          if (!bVar1) break;
          pbVar2 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&__begin4);
          bVar3 = (pbVar2->m_data).m_type - number_integer;
          if (bVar3 < 2) {
            local_84 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::get_impl<int,_0>(pbVar2);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (__return_storage_ptr__,&local_84);
          }
          else if (bVar3 == 2) {
            dVar4 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::get_impl<double,_0>(pbVar2);
            local_84 = (int)dVar4;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (__return_storage_ptr__,&local_84);
          }
          nlohmann::json_abi_v3_11_3::detail::
          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          ::operator++(&__begin4);
        }
      }
      else if ((byte)(v.m_data.m_type - number_integer) < 2) {
        __begin4.m_object._0_4_ =
             nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::get_impl<int,_0>(&v);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (__return_storage_ptr__,(int *)&__begin4);
      }
      else if ((value_t)(v.m_data.m_type - number_integer) == 2) {
        dVar4 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::get_impl<double,_0>(&v);
        __begin4.m_object._0_4_ = (int)dVar4;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (__return_storage_ptr__,(int *)&__begin4);
      }
      else {
        if (v.m_data.m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&__begin4,&v,jVar5.m_data.m_value.object);
          __end4.m_object._0_4_ = std::__cxx11::stoi((string *)&__begin4,(size_t *)0x0,10);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (__return_storage_ptr__,(int *)&__end4);
        }
        else {
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&__begin4,
                     (basic_string_view<char,_std::char_traits<char>_> *)&queryres_local,
                     (allocator<char> *)&local_84);
          __end4.m_object._0_4_ = std::__cxx11::stoi((string *)&__begin4,(size_t *)0x0,10);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (__return_storage_ptr__,(int *)&__end4);
        }
        std::__cxx11::string::~string((string *)&__begin4);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&v.m_data);
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&__begin4,
                 (basic_string_view<char,_std::char_traits<char>_> *)&queryres_local,
                 (allocator<char> *)&v);
      __end4.m_object._0_4_ = std::__cxx11::stoi((string *)&__begin4,(size_t *)0x0,10);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (__return_storage_ptr__,(int *)&__end4);
      std::__cxx11::string::~string((string *)&__begin4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> vectorizeIndexQuery(std::string_view queryres)
{
    std::vector<int> result;
    if (queryres.empty()) {
        return result;
    }

    if (queryres.front() == '[') {
        try {
            auto v = fileops::loadJsonStr(queryres);
            if (v.is_array()) {
                for (auto& val : v) {
                    if (val.is_number_integer()) {
                        result.push_back(val.get<int>());
                    } else if (val.is_number()) {
                        result.push_back(val.get<double>());
                    } else {
                        continue;
                    }
                }
            } else if (v.is_number_integer()) {
                result.push_back(v.get<int>());
            } else if (v.is_number()) {
                result.push_back(v.get<double>());
            } else if (v.is_string()) {
                result.push_back(std::stoi(v.get<std::string>()));
            } else {
                result.push_back(std::stoi(std::string(queryres)));
            }
            return result;
        }
        catch (...) {
        }
    }
    try {
        result.push_back(std::stoi(std::string(queryres)));
    }
    catch (const std::invalid_argument&) {
    }
    return result;
}